

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

void torv3::Checksum(Span<const_unsigned_char> addr_pubkey,uint8_t (*checksum) [2])

{
  Span<const_unsigned_char> data;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> data_01;
  undefined2 *in_RDX;
  size_t in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> output;
  uint8_t checksum_full [32];
  SHA3_256 hasher;
  Span<unsigned_char> *in_stack_fffffffffffffe78;
  SHA3_256 *this;
  SHA3_256 *this_00;
  uchar *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  undefined1 local_128 [288];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (SHA3_256 *)(local_128 + 0x48);
  local_128._16_8_ = in_RDI;
  SHA3_256::SHA3_256(this_00);
  this = (SHA3_256 *)local_128;
  Span<const_unsigned_char>::Span<16>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffe78,(uchar (*) [16])0xdfea2f);
  output = Span<const_unsigned_char>::first((Span<const_unsigned_char> *)this_00,(size_t)this);
  data.m_size = in_stack_fffffffffffffec8;
  data.m_data = in_stack_fffffffffffffec0;
  SHA3_256::Write((SHA3_256 *)output.m_size,data);
  data_00.m_size = local_128._16_8_;
  data_00.m_data = in_stack_fffffffffffffec0;
  SHA3_256::Write((SHA3_256 *)output.m_size,data_00);
  Span<const_unsigned_char>::Span<1>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffe78,(uchar (*) [1])0xdfea8b);
  data_01.m_size = local_128._16_8_;
  data_01.m_data = in_stack_fffffffffffffec0;
  SHA3_256::Write((SHA3_256 *)output.m_size,data_01);
  Span<unsigned_char>::Span<32>(in_stack_fffffffffffffe78,(uchar (*) [32])0xdfeab1);
  SHA3_256::Finalize(this,(Span<unsigned_char>)output);
  *in_RDX = local_128._32_2_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Checksum(Span<const uint8_t> addr_pubkey, uint8_t (&checksum)[CHECKSUM_LEN])
{
    // TORv3 CHECKSUM = H(".onion checksum" | PUBKEY | VERSION)[:2]
    static const unsigned char prefix[] = ".onion checksum";
    static constexpr size_t prefix_len = 15;

    SHA3_256 hasher;

    hasher.Write(Span{prefix}.first(prefix_len));
    hasher.Write(addr_pubkey);
    hasher.Write(VERSION);

    uint8_t checksum_full[SHA3_256::OUTPUT_SIZE];

    hasher.Finalize(checksum_full);

    memcpy(checksum, checksum_full, sizeof(checksum));
}